

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetOutputNameArtifactResultGetter<ArtifactPdbTag>::Get_abi_cxx11_
          (string *__return_storage_ptr__,TargetOutputNameArtifactResultGetter<ArtifactPdbTag> *this
          ,cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  _Rb_tree_header *config;
  bool bVar1;
  TargetType TVar2;
  string pdbSupportVar;
  string language;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_50,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"TARGET_PDB_FILE_BASE_NAME not allowed for IMPORTED targets.",
               (allocator<char> *)&local_b0);
    reportError((cmGeneratorExpressionContext *)target,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  config = &(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header;
  cmGeneratorTarget::GetLinkerLanguage(&local_50,(cmGeneratorTarget *)this,(string *)config);
  std::operator+(&local_b0,"CMAKE_",&local_50);
  std::operator+(&local_70,&local_b0,"_LINKER_SUPPORTS_PDB");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = cmMakefile::IsOn(*(cmMakefile **)
                            (*(long *)&(target->LinkOptionsCache)._M_t._M_impl + 0x70),&local_70);
  if (bVar1) {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if ((TVar2 < OBJECT_LIBRARY) && (TVar2 != STATIC_LIBRARY)) {
      cmGeneratorTarget::GetPDBOutputName(&local_b0,(cmGeneratorTarget *)this,(string *)config);
      cmGeneratorTarget::GetFilePostfix(&local_90,(cmGeneratorTarget *)this,(string *)config);
      std::operator+(__return_storage_ptr__,&local_b0,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_004293ad;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "TARGET_PDB_FILE_BASE_NAME is allowed only for targets with linker created artifacts."
               ,&local_b1);
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_90);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "TARGET_PDB_FILE_BASE_NAME is not supported by the target linker.",&local_b1);
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_004293ad:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string Get(cmGeneratorTarget* target,
                         cmGeneratorExpressionContext* context,
                         const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_PDB_FILE_BASE_NAME not allowed for IMPORTED targets.");
      return std::string();
    }

    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if (!context->LG->GetMakefile()->IsOn(pdbSupportVar)) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_PDB_FILE_BASE_NAME is not supported by the target linker.");
      return std::string();
    }

    cmStateEnums::TargetType targetType = target->GetType();

    if (targetType != cmStateEnums::SHARED_LIBRARY &&
        targetType != cmStateEnums::MODULE_LIBRARY &&
        targetType != cmStateEnums::EXECUTABLE) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE_BASE_NAME is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
    }

    return target->GetPDBOutputName(context->Config) +
      target->GetFilePostfix(context->Config);
  }